

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gen-room.c
# Opt level: O0

_Bool build_template(chunk_conflict *c,loc centre,wchar_t rating)

{
  _Bool _Var1;
  wchar_t rating_local;
  chunk_conflict *c_local;
  loc centre_local;
  
  _Var1 = build_room_template_type(c,centre,L'\x01',rating);
  return _Var1;
}

Assistant:

bool build_template(struct chunk *c, struct loc centre, int rating)
{
	/* All room templates currently have type 1 */
	return build_room_template_type(c, centre, 1, rating);
}